

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

uint64_t __thiscall
kj::anon_unknown_77::AsyncTee::Buffer::consume
          (Buffer *this,ArrayPtr<unsigned_char> *readBuffer,size_t *minBytes)

{
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> WVar1;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> start;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> this_00;
  size_t *this_01;
  bool bVar2;
  size_t sVar3;
  uchar *__dest;
  uchar *__src;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> WVar4;
  ArrayPtr<unsigned_char> content;
  byte local_a1;
  Array<unsigned_char> local_78;
  ArrayPtr<unsigned_char> local_60;
  size_t local_50;
  size_t local_48;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> local_40;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> amount;
  value_type *bytes;
  uint64_t totalAmount;
  size_t *minBytes_local;
  ArrayPtr<unsigned_char> *readBuffer_local;
  Buffer *this_local;
  
  bytes = (value_type *)0x0;
  totalAmount = (uint64_t)minBytes;
  minBytes_local = (size_t *)readBuffer;
  readBuffer_local = (ArrayPtr<unsigned_char> *)this;
  while( true ) {
    sVar3 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)minBytes_local);
    local_a1 = 0;
    if (sVar3 != 0) {
      bVar2 = std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::
              empty(&this->bufferList);
      local_a1 = bVar2 ^ 0xff;
    }
    if ((local_a1 & 1) == 0) break;
    amount = (WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_>)
             std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::front
                       (&this->bufferList);
    local_48 = Array<unsigned_char>::size((Array<unsigned_char> *)amount);
    local_50 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)minBytes_local);
    local_40 = min<unsigned_long,unsigned_long>(&local_48,&local_50);
    __dest = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)minBytes_local);
    __src = Array<unsigned_char>::begin((Array<unsigned_char> *)amount);
    memcpy(__dest,__src,local_40);
    this_01 = minBytes_local;
    WVar1 = local_40;
    bytes = (value_type *)((long)&bytes->ptr + local_40);
    sVar3 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)minBytes_local);
    local_60 = ArrayPtr<unsigned_char>::slice((ArrayPtr<unsigned_char> *)this_01,WVar1,sVar3);
    *minBytes_local = (size_t)local_60.ptr;
    minBytes_local[1] = local_60.size_;
    WVar4 = min<unsigned_long&,unsigned_long&>(&local_40,(unsigned_long *)totalAmount);
    WVar1 = local_40;
    *(WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> *)totalAmount =
         *(long *)totalAmount - WVar4;
    sVar3 = Array<unsigned_char>::size((Array<unsigned_char> *)amount);
    this_00 = amount;
    start = local_40;
    if (WVar1 != sVar3) {
      sVar3 = Array<unsigned_char>::size((Array<unsigned_char> *)amount);
      content = Array<unsigned_char>::slice((Array<unsigned_char> *)this_00,start,sVar3);
      heapArray<unsigned_char>(&local_78,content);
      Array<unsigned_char>::operator=((Array<unsigned_char> *)amount,&local_78);
      Array<unsigned_char>::~Array(&local_78);
      return (uint64_t)bytes;
    }
    std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::pop_front
              (&this->bufferList);
  }
  return (uint64_t)bytes;
}

Assistant:

uint64_t AsyncTee::Buffer::consume(ArrayPtr<byte>& readBuffer, size_t& minBytes) {
  uint64_t totalAmount = 0;

  while (readBuffer.size() > 0 && !bufferList.empty()) {
    auto& bytes = bufferList.front();
    auto amount = kj::min(bytes.size(), readBuffer.size());
    memcpy(readBuffer.begin(), bytes.begin(), amount);
    totalAmount += amount;

    readBuffer = readBuffer.slice(amount, readBuffer.size());
    minBytes -= kj::min(amount, minBytes);

    if (amount == bytes.size()) {
      bufferList.pop_front();
    } else {
      bytes = heapArray(bytes.slice(amount, bytes.size()));
      return totalAmount;
    }
  }

  return totalAmount;
}